

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall netbase_tests::netbase_parsenetwork::test_method(netbase_parsenetwork *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffff598;
  lazy_ostream *in_stack_fffffffffffff5a0;
  basic_cstring<const_char> *in_stack_fffffffffffff5a8;
  const_string *in_stack_fffffffffffff5c0;
  size_t in_stack_fffffffffffff5c8;
  size_t line_num;
  const_string *in_stack_fffffffffffff5d0;
  const_string *file;
  allocator<char> *in_stack_fffffffffffff5d8;
  allocator<char> *__a;
  char *in_stack_fffffffffffff5e0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_fffffffffffff5f0;
  Network in_stack_fffffffffffff5f4;
  undefined1 local_704 [7];
  const_string local_6fd;
  undefined1 local_6e8 [32];
  allocator<char> local_6c8 [16];
  const_string local_6b8;
  undefined1 local_6a4 [8];
  Network local_69c;
  undefined1 local_698 [16];
  undefined1 local_688 [68];
  undefined1 local_644 [8];
  Network local_63c;
  undefined1 local_638 [16];
  undefined1 local_628 [68];
  undefined1 local_5e4 [8];
  Network local_5dc;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [68];
  undefined1 local_584 [8];
  Network local_57c;
  undefined1 local_578 [16];
  undefined1 local_568 [68];
  undefined1 local_524 [8];
  Network local_51c;
  undefined1 local_518 [16];
  undefined1 local_508 [68];
  undefined1 local_4c4 [8];
  Network local_4bc;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [68];
  undefined1 local_464 [8];
  Network local_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [68];
  undefined1 local_404 [8];
  Network local_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [68];
  undefined1 local_3a4 [8];
  Network local_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [68];
  undefined1 local_344 [8];
  Network local_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [68];
  undefined1 local_2e4 [8];
  Network local_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [68];
  undefined1 local_284 [8];
  Network local_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [68];
  undefined1 local_224 [8];
  Network local_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_21c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_224._0_4_ = 1;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c127f9;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_224;
    in_stack_fffffffffffff598 = "ParseNetwork(\"ipv4\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_208,local_218,0x15a,1,2,&local_21c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_224 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_27c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_284._0_4_ = 2;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c12835;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_284;
    in_stack_fffffffffffff598 = "ParseNetwork(\"ipv6\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_268,local_278,0x15b,1,2,&local_27c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_284 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_2dc = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_2e4._0_4_ = 3;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c1289a;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_2e4;
    in_stack_fffffffffffff598 = "ParseNetwork(\"onion\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_2c8,local_2d8,0x15c,1,2,&local_2dc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_2e4 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_33c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_344._0_4_ = 3;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c1289a;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_344;
    in_stack_fffffffffffff598 = "ParseNetwork(\"tor\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_328,local_338,0x15d,1,2,&local_33c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_344 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_39c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_3a4._0_4_ = 5;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c0a98d;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_3a4;
    in_stack_fffffffffffff598 = "ParseNetwork(\"cjdns\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_388,local_398,0x15e,1,2,&local_39c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_3a4 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_3fc = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_404._0_4_ = 1;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c127f9;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_404;
    in_stack_fffffffffffff598 = "ParseNetwork(\"IPv4\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_3e8,local_3f8,0x160,1,2,&local_3fc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_404 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_45c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_464._0_4_ = 2;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c12835;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_464;
    in_stack_fffffffffffff598 = "ParseNetwork(\"IPv6\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_448,local_458,0x161,1,2,&local_45c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_464 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_4bc = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_4c4._0_4_ = 3;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c1289a;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_4c4;
    in_stack_fffffffffffff598 = "ParseNetwork(\"ONION\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_4a8,local_4b8,0x162,1,2,&local_4bc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_4c4 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_51c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_524._0_4_ = 3;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c1289a;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_524;
    in_stack_fffffffffffff598 = "ParseNetwork(\"TOR\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_508,local_518,0x163,1,2,&local_51c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_524 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_57c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_584._0_4_ = 5;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c0a98d;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_584;
    in_stack_fffffffffffff598 = "ParseNetwork(\"CJDNS\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_568,local_578,0x164,1,2,&local_57c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_584 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_5dc = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_5e4._0_4_ = 0;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c12795;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_5e4;
    in_stack_fffffffffffff598 = "ParseNetwork(\":)\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_5c8,local_5d8,0x166,1,2,&local_5dc);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_5e4 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    local_63c = ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0)
                            );
    local_644._0_4_ = 0;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c12795;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_644;
    in_stack_fffffffffffff598 = anon_var_dwarf_820ae5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_628,local_638,0x167,1,2,&local_63c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_644 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
               in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    in_stack_fffffffffffff5f4 =
         ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
    local_6a4._0_4_ = 0;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c12795;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_6a4;
    in_stack_fffffffffffff598 = "ParseNetwork(\"\\xfe\\xff\")";
    local_69c = in_stack_fffffffffffff5f4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_688,local_698,0x168,1,2,&local_69c);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_6a4 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __s = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
    ;
    file = &local_6b8;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    __a = local_6c8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff598);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,file,line_num,in_stack_fffffffffffff5c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff5a0,(char (*) [1])in_stack_fffffffffffff598);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffff5a8,(pointer)in_stack_fffffffffffff5a0,
               (unsigned_long)in_stack_fffffffffffff598);
    in_stack_fffffffffffff5c0 = (const_string *)(local_704 + 7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
    local_6fd.m_begin._1_4_ =
         ParseNetwork((string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
    local_704._0_4_ = 0;
    in_stack_fffffffffffff5a8 = (basic_cstring<const_char> *)0x1c12795;
    in_stack_fffffffffffff5a0 = (lazy_ostream *)local_704;
    in_stack_fffffffffffff598 = "ParseNetwork(\"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
              (local_6e8,(undefined1 *)((long)&local_6fd.m_begin + 5),0x169,1,2,
               (undefined1 *)((long)&local_6fd.m_begin + 1));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff598);
    std::allocator<char>::~allocator((allocator<char> *)(local_704 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff598);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_parsenetwork)
{
    BOOST_CHECK_EQUAL(ParseNetwork("ipv4"), NET_IPV4);
    BOOST_CHECK_EQUAL(ParseNetwork("ipv6"), NET_IPV6);
    BOOST_CHECK_EQUAL(ParseNetwork("onion"), NET_ONION);
    BOOST_CHECK_EQUAL(ParseNetwork("tor"), NET_ONION);
    BOOST_CHECK_EQUAL(ParseNetwork("cjdns"), NET_CJDNS);

    BOOST_CHECK_EQUAL(ParseNetwork("IPv4"), NET_IPV4);
    BOOST_CHECK_EQUAL(ParseNetwork("IPv6"), NET_IPV6);
    BOOST_CHECK_EQUAL(ParseNetwork("ONION"), NET_ONION);
    BOOST_CHECK_EQUAL(ParseNetwork("TOR"), NET_ONION);
    BOOST_CHECK_EQUAL(ParseNetwork("CJDNS"), NET_CJDNS);

    BOOST_CHECK_EQUAL(ParseNetwork(":)"), NET_UNROUTABLE);
    BOOST_CHECK_EQUAL(ParseNetwork("tÖr"), NET_UNROUTABLE);
    BOOST_CHECK_EQUAL(ParseNetwork("\xfe\xff"), NET_UNROUTABLE);
    BOOST_CHECK_EQUAL(ParseNetwork(""), NET_UNROUTABLE);
}